

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashsearch2.h
# Opt level: O2

bool testSeed<std::__cxx11::string>
               (Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *bin,size_t n2,vector<bool,_std::allocator<bool>_> *final_layer)

{
  pointer pbVar1;
  uint32_t uVar2;
  ulong uVar3;
  ulong __n;
  long lVar4;
  ulong uVar5;
  size_t j;
  long lVar6;
  ulong uVar7;
  reference rVar8;
  
  lVar6 = (long)(bin->keys).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(bin->keys).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  uVar7 = lVar6 >> 5;
  do {
    uVar5 = uVar7;
    if (uVar5 == 0) break;
    uVar2 = hash2((bin->keys).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + (uVar5 - 1),&bin->seed);
    __n = (ulong)(uVar2 & (uint)n2);
    rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[](final_layer,__n);
    uVar3 = rVar8._M_mask & *rVar8._M_p;
    lVar4 = lVar6;
    uVar7 = uVar5;
    if (uVar3 == 0) {
      rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[](final_layer,__n);
      *rVar8._M_p = *rVar8._M_p | rVar8._M_mask;
    }
    else {
      for (; pbVar1 = (bin->keys).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
          uVar7 < (ulong)((long)(bin->keys).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
          uVar7 = uVar7 + 1) {
        uVar2 = hash2((string *)((long)&(pbVar1->_M_dataplus)._M_p + lVar4),&bin->seed);
        rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          (final_layer,(ulong)(uVar2 & (uint)n2));
        *rVar8._M_p = *rVar8._M_p & ~rVar8._M_mask;
        lVar4 = lVar4 + 0x20;
      }
    }
    lVar6 = lVar6 + -0x20;
    uVar7 = uVar5 - 1;
  } while (uVar3 == 0);
  return uVar5 == 0;
}

Assistant:

bool testSeed(const Bin<KeyType>& bin, size_t n2, std::vector<bool>& final_layer){
    for(size_t i = bin.keys.size()-1; i < std::numeric_limits<size_t>::max(); i--){
        const KeyType& key = bin.keys[i];
        const uint32_t h = hash2(key, bin.seed) & n2;
        if(final_layer[h]){
            for(size_t j = i + 1; j < bin.keys.size(); j++){
                const KeyType& key = bin.keys[j];
                const uint32_t h = hash2(key, bin.seed) & n2;
                final_layer[h] = false;
            }

            return false;
        }

        final_layer[h] = true;
    }

    return true;
}